

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

int Curl_resolver_getsock(connectdata *conn,curl_socket_t *socks,int numsocks)

{
  Curl_easy *data;
  undefined1 (*pauVar1) [12];
  ulong uVar2;
  ulong milli;
  curltime cVar3;
  curltime newer;
  
  data = conn->data;
  pauVar1 = (undefined1 (*) [12])(data->state).resolver;
  cVar3 = Curl_now();
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar3._0_12_,0);
  newer.tv_usec = SUB124(cVar3._0_12_,8);
  cVar3._12_4_ = 0;
  cVar3._0_12_ = *pauVar1;
  uVar2 = Curl_timediff(newer,cVar3);
  if ((long)uVar2 < 3) {
    milli = 0;
  }
  else if (uVar2 < 0x33) {
    milli = (ulong)(byte)(((ushort)uVar2 & 0xff) / 3);
  }
  else {
    milli = 200;
    if (uVar2 < 0xfb) {
      milli = 0x32;
    }
  }
  Curl_expire(data,milli,EXPIRE_ASYNC_NAME);
  return 0;
}

Assistant:

int Curl_resolver_getsock(struct connectdata *conn,
                          curl_socket_t *socks,
                          int numsocks)
{
  time_t milli;
  timediff_t ms;
  struct Curl_easy *data = conn->data;
  struct resdata *reslv = (struct resdata *)data->state.resolver;
  (void)socks;
  (void)numsocks;
  ms = Curl_timediff(Curl_now(), reslv->start);
  if(ms < 3)
    milli = 0;
  else if(ms <= 50)
    milli = ms/3;
  else if(ms <= 250)
    milli = 50;
  else
    milli = 200;
  Curl_expire(data, milli, EXPIRE_ASYNC_NAME);
  return 0;
}